

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Oscilloscope.cpp
# Opt level: O3

double __thiscall chrono::ChFunction_Oscilloscope::Get_y(ChFunction_Oscilloscope *this,double x)

{
  int iVar1;
  _List_node_base *p_Var2;
  undefined1 auVar3 [16];
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined8 in_XMM4_Qa;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined8 in_XMM5_Qa;
  undefined1 auVar12 [16];
  
  auVar7._8_8_ = 0;
  auVar7._0_8_ = this->end_x;
  dVar4 = 0.0;
  if (x <= this->end_x) {
    auVar9._8_8_ = 0;
    auVar9._0_8_ = this->dx;
    auVar10._0_8_ = (double)(this->amount + -1);
    auVar10._8_8_ = in_XMM4_Qa;
    auVar7 = vfnmadd213sd_fma(auVar10,auVar9,auVar7);
    if (auVar7._0_8_ <= x) {
      p_Var2 = (this->values).super__List_base<double,_std::allocator<double>_>._M_impl._M_node.
               super__List_node_base._M_next;
      auVar5._0_8_ = (x - auVar7._0_8_) / this->dx;
      auVar5._8_8_ = 0;
      auVar10 = vroundsd_avx(auVar5,auVar5,9);
      auVar6._0_4_ = (int)auVar10._0_8_;
      auVar6._4_4_ = (int)auVar10._8_8_;
      auVar6._8_8_ = 0;
      iVar1 = (int)auVar10._0_8_ + 1;
      auVar8._0_8_ = (double)iVar1;
      auVar8._8_8_ = in_XMM5_Qa;
      auVar10 = vcvtdq2pd_avx(auVar6);
      auVar10 = vfmadd213sd_fma(auVar10,auVar9,auVar7);
      auVar7 = vfmadd213sd_fma(auVar8,auVar9,auVar7);
      dVar4 = 0.0;
      for (; p_Var2 != (_List_node_base *)&this->values; p_Var2 = p_Var2->_M_next) {
        iVar1 = iVar1 + -1;
        if (iVar1 == 0) {
          auVar11._8_8_ = 0;
          auVar11._0_8_ = p_Var2[1]._M_next;
          dVar4 = (double)p_Var2->_M_next[1]._M_next;
          goto LAB_0088f49d;
        }
      }
      auVar11 = ZEXT816(0) << 0x40;
LAB_0088f49d:
      auVar3._8_8_ = 0;
      auVar3._0_8_ = (auVar7._0_8_ - x) * dVar4;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = x - auVar10._0_8_;
      auVar9 = vfmadd231sd_fma(auVar3,auVar11,auVar12);
      dVar4 = auVar9._0_8_ / (auVar7._0_8_ - auVar10._0_8_);
    }
  }
  return dVar4;
}

Assistant:

double ChFunction_Oscilloscope::Get_y(double x) const {
    double y = 0;

    double start_x = this->end_x - this->dx * (this->amount - 1);
    if (x > end_x)
        return 0;
    if (x < start_x)
        return 0;

    int i1 = (int)floor((x - start_x) / this->dx);
    int i2 = i1 + 1;
    double p1x = start_x + dx * (double)i1;
    double p2x = start_x + dx * (double)i2;
    double p1y = 0;
    double p2y = 0;
    int count = 0;
    std::list<double>::const_iterator iter = values.begin();
    while (iter != values.end()) {
        if (count == i1) {
            p2y = *iter;
            iter++;
            p1y = *iter;
            break;
        }
        count++;
        iter++;
    }

    y = ((x - p1x) * p2y + (p2x - x) * p1y) / (p2x - p1x);

    return y;
}